

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ClassDeclarationSyntax * __thiscall slang::parsing::Parser::parseClass(Parser *this)

{
  bool bVar1;
  ClassDeclarationSyntax *pCVar2;
  Token TVar3;
  Token local_40;
  undefined1 local_30 [8];
  Token virtualOrInterface;
  AttrList attributes;
  Parser *this_local;
  
  join_0x00000010_0x00000000_ = parseAttributes(this);
  Token::Token((Token *)local_30);
  bVar1 = ParserBase::peek(&this->super_ParserBase,VirtualKeyword);
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,InterfaceKeyword), bVar1)) {
    TVar3 = ParserBase::consume(&this->super_ParserBase);
    local_40._0_8_ = TVar3._0_8_;
    local_30._0_2_ = local_40.kind;
    local_30[2] = local_40._2_1_;
    local_30[3] = local_40.numFlags.raw;
    local_30._4_4_ = local_40.rawLen;
    local_40.info = TVar3.info;
    virtualOrInterface._0_8_ = local_40.info;
  }
  TVar3.info = (Info *)virtualOrInterface._0_8_;
  TVar3.kind = local_30._0_2_;
  TVar3._2_1_ = local_30[2];
  TVar3.numFlags.raw = local_30[3];
  TVar3.rawLen = local_30._4_4_;
  pCVar2 = parseClassDeclaration(this,stack0xffffffffffffffe0,TVar3);
  return pCVar2;
}

Assistant:

ClassDeclarationSyntax& Parser::parseClass() {
    auto attributes = parseAttributes();

    Token virtualOrInterface;
    if (peek(TokenKind::VirtualKeyword) || peek(TokenKind::InterfaceKeyword))
        virtualOrInterface = consume();

    return parseClassDeclaration(attributes, virtualOrInterface);
}